

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSender.cpp
# Opt level: O3

bool __thiscall MyServer::Initialize(MyServer *this,string *fileSendPath,string *fileSendName)

{
  ostringstream *this_00;
  OutputWorker *this_01;
  SDKJsonResult result;
  char *local_1f0;
  long local_1e8;
  char local_1e0 [16];
  SDKJsonResult local_1d0;
  undefined1 local_1a8 [392];
  
  std::__cxx11::string::_M_assign((string *)&this->FileSendPath);
  std::__cxx11::string::_M_assign((string *)&this->FileSendName);
  (this->super_SDKSocket).Config.UDPListenPort = 0x285d;
  (this->super_SDKSocket).Config.MaximumClients = 10;
  (this->super_SDKSocket).Config.BandwidthLimitBPS = 1000000000;
  tonk::SDKSocket::Create(&local_1d0,&this->super_SDKSocket);
  if (local_1d0.super_SDKResult.Result != Tonk_Success) {
    local_1f0 = local_1e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f0,local_1d0.ErrorJson._M_dataplus._M_p,
               local_1d0.ErrorJson._M_dataplus._M_p + local_1d0.ErrorJson._M_string_length);
    if ((int)Logger.ChannelMinLevel < 5) {
      this_00 = (ostringstream *)(local_1a8 + 0x10);
      local_1a8._0_8_ = Logger.ChannelName;
      local_1a8._8_4_ = Error;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Unable to create socket: ",0x19);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,local_1f0,local_1e8);
      this_01 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(this_01,(LogStringBuffer *)local_1a8);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
    }
    if (local_1f0 != local_1e0) {
      operator_delete(local_1f0);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0.ErrorJson._M_dataplus._M_p != &local_1d0.ErrorJson.field_2) {
    operator_delete(local_1d0.ErrorJson._M_dataplus._M_p);
  }
  return local_1d0.super_SDKResult.Result == Tonk_Success;
}

Assistant:

bool MyServer::Initialize(
    const std::string& fileSendPath,
    const std::string& fileSendName)
{
    FileSendPath = fileSendPath;
    FileSendName = fileSendName;

    // Set configuration
    Config.UDPListenPort = kFileSenderServerPort;
    Config.MaximumClients = 10;
    //Config.EnableFEC = 0;
    //Config.InterfaceAddress = "127.0.0.1";
    Config.BandwidthLimitBPS = 1000 * 1000 * 1000;

    tonk::SDKJsonResult result = Create();
    if (!result) {
        Logger.Error("Unable to create socket: ", result.ToString());
        return false;
    }

    return true;
}